

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-nice-strict.h
# Opt level: O0

void __thiscall
testing::StrictMock<bssl::(anonymous_namespace)::MockCertIssuerSource>::StrictMock
          (StrictMock<bssl::(anonymous_namespace)::MockCertIssuerSource> *this)

{
  StrictMock<bssl::(anonymous_namespace)::MockCertIssuerSource> *this_local;
  
  internal::StrictMockImpl<bssl::(anonymous_namespace)::MockCertIssuerSource>::StrictMockImpl
            ((StrictMockImpl<bssl::(anonymous_namespace)::MockCertIssuerSource> *)this);
  (this->super_MockCertIssuerSource).gmock02_AsyncGetIssuersOf_1835.super_UntypedFunctionMockerBase.
  untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_MockCertIssuerSource).gmock02_AsyncGetIssuersOf_1835.
           super_UntypedFunctionMockerBase.untyped_expectations_.
           super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_MockCertIssuerSource).gmock02_AsyncGetIssuersOf_1835.
           super_UntypedFunctionMockerBase.untyped_on_call_specs_.
           super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_MockCertIssuerSource).gmock02_AsyncGetIssuersOf_1835.
           super_UntypedFunctionMockerBase.untyped_on_call_specs_.
           super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_MockCertIssuerSource).gmock02_AsyncGetIssuersOf_1835.super_UntypedFunctionMockerBase.
  name_ = (char *)0x0;
  (this->super_MockCertIssuerSource).gmock02_AsyncGetIssuersOf_1835.super_UntypedFunctionMockerBase.
  untyped_on_call_specs_.super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_MockCertIssuerSource).gmock02_AsyncGetIssuersOf_1835.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)0x0;
  (this->super_MockCertIssuerSource).gmock02_AsyncGetIssuersOf_1835.super_UntypedFunctionMockerBase.
  mock_obj_ = (void *)0x0;
  *(pointer *)
   ((long)&(this->super_MockCertIssuerSource).gmock02_SyncGetIssuersOf_1833.
           super_UntypedFunctionMockerBase.untyped_expectations_.
           super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_MockCertIssuerSource).gmock02_SyncGetIssuersOf_1833.
           super_UntypedFunctionMockerBase.untyped_expectations_.
           super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_MockCertIssuerSource).gmock02_SyncGetIssuersOf_1833.
           super_UntypedFunctionMockerBase.untyped_on_call_specs_.
           super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_MockCertIssuerSource).gmock02_SyncGetIssuersOf_1833.super_UntypedFunctionMockerBase.
  untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_MockCertIssuerSource).gmock02_SyncGetIssuersOf_1833.super_UntypedFunctionMockerBase.
  untyped_on_call_specs_.super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_MockCertIssuerSource).gmock02_SyncGetIssuersOf_1833.
           super_UntypedFunctionMockerBase.untyped_on_call_specs_.
           super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  (this->super_MockCertIssuerSource).gmock02_SyncGetIssuersOf_1833.super_UntypedFunctionMockerBase.
  mock_obj_ = (void *)0x0;
  (this->super_MockCertIssuerSource).gmock02_SyncGetIssuersOf_1833.super_UntypedFunctionMockerBase.
  name_ = (char *)0x0;
  (this->super_MockCertIssuerSource).super_CertIssuerSource._vptr_CertIssuerSource =
       (_func_int **)0x0;
  (this->super_MockCertIssuerSource).gmock02_SyncGetIssuersOf_1833.super_UntypedFunctionMockerBase.
  _vptr_UntypedFunctionMockerBase = (_func_int **)0x0;
  *(pointer *)
   ((long)&(this->super_MockCertIssuerSource).gmock02_AsyncGetIssuersOf_1835.
           super_UntypedFunctionMockerBase.untyped_expectations_.
           super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  bssl::anon_unknown_0::MockCertIssuerSource::MockCertIssuerSource
            (&this->super_MockCertIssuerSource);
  (this->super_MockCertIssuerSource).super_CertIssuerSource._vptr_CertIssuerSource =
       (_func_int **)&PTR__StrictMock_00934480;
  return;
}

Assistant:

StrictMock() : MockClass() {
    static_assert(sizeof(*this) == sizeof(MockClass),
                  "The impl subclass shouldn't introduce any padding");
  }